

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

void deqp::gles31::bb::anon_unknown_11::generateValues
               (BufferLayout *layout,
               vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
               *blockPointers,deUint32 seed)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference entry;
  BufferVarLayoutEntry *varEntry;
  int local_50;
  int varNdx;
  int entryNdx;
  int numEntries;
  BlockDataPtr *blockPtr;
  BlockLayoutEntry *blockLayout;
  int blockNdx;
  int numBlocks;
  Random rnd;
  deUint32 seed_local;
  vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
  *blockPointers_local;
  BufferLayout *layout_local;
  
  rnd.m_rnd.z = seed;
  unique0x10000108 = blockPointers;
  de::Random::Random((Random *)&blockNdx,seed);
  sVar1 = std::
          vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
          ::size(&layout->blocks);
  for (blockLayout._4_4_ = 0; blockLayout._4_4_ < (int)sVar1;
      blockLayout._4_4_ = blockLayout._4_4_ + 1) {
    pvVar2 = std::
             vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
             ::operator[](&layout->blocks,(long)blockLayout._4_4_);
    pvVar3 = std::
             vector<deqp::gles31::bb::BlockDataPtr,_std::allocator<deqp::gles31::bb::BlockDataPtr>_>
             ::operator[](stack0xffffffffffffffe8,(long)blockLayout._4_4_);
    pvVar4 = std::
             vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
             ::operator[](&layout->blocks,(long)blockLayout._4_4_);
    sVar5 = std::vector<int,_std::allocator<int>_>::size(&pvVar4->activeVarIndices);
    for (local_50 = 0; local_50 < (int)sVar5; local_50 = local_50 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&pvVar2->activeVarIndices,(long)local_50);
      entry = std::
              vector<deqp::gles31::bb::BufferVarLayoutEntry,_std::allocator<deqp::gles31::bb::BufferVarLayoutEntry>_>
              ::operator[](&layout->bufferVars,(long)*pvVar6);
      generateValue(entry,pvVar3->lastUnsizedArraySize,pvVar3->ptr,(Random *)&blockNdx);
    }
  }
  de::Random::~Random((Random *)&blockNdx);
  return;
}

Assistant:

void generateValues (const BufferLayout& layout, const vector<BlockDataPtr>& blockPointers, deUint32 seed)
{
	de::Random	rnd			(seed);
	const int	numBlocks	= (int)layout.blocks.size();

	DE_ASSERT(numBlocks == (int)blockPointers.size());

	for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
	{
		const BlockLayoutEntry&	blockLayout	= layout.blocks[blockNdx];
		const BlockDataPtr&		blockPtr	= blockPointers[blockNdx];
		const int				numEntries	= (int)layout.blocks[blockNdx].activeVarIndices.size();

		for (int entryNdx = 0; entryNdx < numEntries; entryNdx++)
		{
			const int					varNdx		= blockLayout.activeVarIndices[entryNdx];
			const BufferVarLayoutEntry&	varEntry	= layout.bufferVars[varNdx];

			generateValue(varEntry, blockPtr.lastUnsizedArraySize, blockPtr.ptr, rnd);
		}
	}
}